

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O2

void drm_nouveau_gem_new(uint32_t fd,uint32_t cid,uint32_t parent,drm_nouveau_gem_info *info)

{
  size_t __size;
  uint64_t uVar1;
  gpu_object *pgVar2;
  uint8_t *__s;
  gpu_mapping *pgVar3;
  cpu_mapping *pcVar4;
  
  pgVar2 = gpu_object_add(fd,cid,parent,info->handle,0);
  __size = info->size;
  pgVar2->length = __size;
  __s = (uint8_t *)realloc(pgVar2->data,__size);
  pgVar2->data = __s;
  memset(__s,0,pgVar2->length);
  pgVar3 = (gpu_mapping *)calloc(0x38,1);
  pgVar3->fd = fd;
  pgVar3->address = info->offset;
  uVar1 = info->size;
  pgVar3->length = uVar1;
  pgVar3->object = pgVar2;
  pgVar3->next = pgVar2->gpu_mappings;
  pgVar2->gpu_mappings = pgVar3;
  pcVar4 = (cpu_mapping *)calloc(0x100,1);
  pcVar4->fd = fd;
  pcVar4->fdtype = FDDRM;
  pcVar4->mmap_offset = info->map_handle;
  pcVar4->length = uVar1;
  pcVar4->data = __s;
  pcVar4->object = pgVar2;
  pcVar4->next = pgVar2->cpu_mappings;
  pgVar2->cpu_mappings = pcVar4;
  return;
}

Assistant:

static void drm_nouveau_gem_new(uint32_t fd, uint32_t cid, uint32_t parent, struct drm_nouveau_gem_info *info)
{
	struct gpu_object *obj = gpu_object_add(fd, cid, parent, info->handle, 0);
	obj->length = info->size;
	obj->data = realloc(obj->data, obj->length);
	memset(obj->data, 0, obj->length);

	struct gpu_mapping *gmapping = calloc(sizeof(struct gpu_mapping), 1);
	gmapping->fd = fd;
	gmapping->address = info->offset;
	gmapping->length = info->size;
	gmapping->object = obj;
	gmapping->next = obj->gpu_mappings;
	obj->gpu_mappings = gmapping;

	struct cpu_mapping *cmapping = calloc(sizeof(struct cpu_mapping), 1);
	cmapping->fd = fd;
	cmapping->fdtype = FDDRM;
	cmapping->mmap_offset = info->map_handle;
	cmapping->length = info->size;
	cmapping->data = obj->data;
	cmapping->object = obj;
	cmapping->next = obj->cpu_mappings;
	obj->cpu_mappings = cmapping;
}